

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfd_js_api_json_autogen.h
# Opt level: O0

void __thiscall cfd::js::api::json::VerifySignRequest::VerifySignRequest(VerifySignRequest *this)

{
  allocator local_11;
  VerifySignRequest *local_10;
  VerifySignRequest *this_local;
  
  local_10 = this;
  core::JsonClassBase<cfd::js::api::json::VerifySignRequest>::JsonClassBase
            (&this->super_JsonClassBase<cfd::js::api::json::VerifySignRequest>);
  (this->super_JsonClassBase<cfd::js::api::json::VerifySignRequest>)._vptr_JsonClassBase =
       (_func_int **)&PTR__VerifySignRequest_01b42988;
  std::
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::set(&this->ignore_items);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&this->tx_,"",&local_11);
  std::allocator<char>::~allocator((allocator<char> *)&local_11);
  this->is_elements_ = false;
  core::
  JsonObjectVector<cfd::js::api::json::VerifySignTxInUtxoData,_cfd::js::api::VerifySignTxInUtxoDataStruct>
  ::JsonObjectVector(&this->txins_);
  CollectFieldName();
  return;
}

Assistant:

VerifySignRequest() {
    CollectFieldName();
  }